

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,normal3d *value)

{
  bool bVar1;
  double3 v;
  array<double,_3UL> local_20;
  
  bVar1 = ParseBasicTypeTuple<double,3ul>(this,&local_20);
  if (bVar1) {
    value->x = local_20._M_elems[0];
    value->y = local_20._M_elems[1];
    value->z = local_20._M_elems[2];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::normal3d *value) {
  value::double3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->x = v[0];
    value->y = v[1];
    value->z = v[2];
    return true;
  }
  return false;
}